

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

bool __thiscall
Inline::TryGetCallApplyInlineeData
          (Inline *this,FunctionJITTimeInfo *inlinerData,Instr *callInstr,Instr *callApplyLdInstr,
          Instr *callApplyTargetLdInstr,FunctionJITTimeInfo **inlineeData,
          InlineCacheIndex *inlineCacheIndex,Instr **callbackDefInstr,bool isCallInstanceFunction,
          CallApplyTargetSourceType *targetType)

{
  InlineCacheIndex inlineCacheIndex_00;
  SymOpnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  ProfileId PVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  PropertySymOpnd *pPVar6;
  FunctionJITTimeInfo *pFVar7;
  JITTimeFunctionBody *pJVar8;
  
  *callbackDefInstr = (Instr *)0x0;
  if (callApplyTargetLdInstr->m_opcode == LdFldForCallApplyTarget) {
    if (callApplyTargetLdInstr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) goto LAB_005522c9;
      *puVar5 = 0;
    }
    if (((ulong)callApplyTargetLdInstr[1]._vptr_Instr & 0x80000) != 0) goto LAB_0055216f;
    this_00 = (SymOpnd *)callApplyTargetLdInstr->m_src1;
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindSym) {
      return false;
    }
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar2) goto LAB_005522c9;
      *puVar5 = 0;
    }
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (!bVar2) {
      return false;
    }
    pPVar6 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_00);
    inlineCacheIndex_00 = pPVar6->m_inlineCacheIndex;
    *inlineCacheIndex = inlineCacheIndex_00;
    pFVar7 = FunctionJITTimeInfo::GetLdFldInlinee(inlinerData,inlineCacheIndex_00);
    *inlineeData = pFVar7;
  }
  else {
LAB_0055216f:
    pFVar7 = *inlineeData;
  }
  if (pFVar7 != (FunctionJITTimeInfo *)0x0) {
    *targetType = LdFld;
    return true;
  }
  bVar2 = TryGetCallApplyCallbackTargetInlineeData
                    (this,inlinerData,callInstr,callApplyLdInstr,inlineeData,callbackDefInstr,
                     isCallInstanceFunction);
  if (bVar2) {
    *targetType = Callback;
    return true;
  }
  if (!isCallInstanceFunction) {
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,InlineAnyCallApplyTargetPhase,sourceContextId,
                       functionId);
    if (!bVar2) {
      if (callInstr->m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar2) {
LAB_005522c9:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      PVar4 = *(ProfileId *)&callInstr[1]._vptr_Instr;
      pJVar8 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
      PVar4 = JITTimeFunctionBody::GetCallApplyCallSiteIdForCallSiteId(pJVar8,PVar4);
      if (PVar4 != 0xffff) {
        pFVar7 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
        pFVar7 = FunctionJITTimeInfo::GetCallApplyTargetInlinee(pFVar7,PVar4);
        *inlineeData = pFVar7;
        goto LAB_005522aa;
      }
    }
  }
  pFVar7 = *inlineeData;
LAB_005522aa:
  if (pFVar7 != (FunctionJITTimeInfo *)0x0) {
    *targetType = Other;
  }
  return pFVar7 != (FunctionJITTimeInfo *)0x0;
}

Assistant:

bool
Inline::TryGetCallApplyInlineeData(
    const FunctionJITTimeInfo* inlinerData,
    IR::Instr * callInstr,
    IR::Instr * callApplyLdInstr,
    IR::Instr * callApplyTargetLdInstr,
    const FunctionJITTimeInfo ** inlineeData,
    Js::InlineCacheIndex * inlineCacheIndex,
    IR::Instr ** callbackDefInstr,
    bool isCallInstanceFunction,
    CallApplyTargetSourceType* targetType
    )
{
    *callbackDefInstr = nullptr;

    if (callApplyTargetLdInstr->m_opcode == Js::OpCode::LdFldForCallApplyTarget &&
        ((callApplyTargetLdInstr->AsProfiledInstr()->u.FldInfo().flags & Js::FldInfo_FromAccessor) == 0))
    {
        IR::Opnd *callTargetLdOpnd = callApplyTargetLdInstr->GetSrc1();
        if (!callTargetLdOpnd->IsSymOpnd() || !callTargetLdOpnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            return false;
        }

        *inlineCacheIndex = callTargetLdOpnd->AsPropertySymOpnd()->m_inlineCacheIndex;
        *inlineeData = inlinerData->GetLdFldInlinee(*inlineCacheIndex);
    }

    if (*inlineeData)
    {
        *targetType = CallApplyTargetSourceType::LdFld;
        return true;
    }

    if (TryGetCallApplyCallbackTargetInlineeData(inlinerData, callInstr, callApplyLdInstr, inlineeData, callbackDefInstr, isCallInstanceFunction))
    {
        *targetType = CallApplyTargetSourceType::Callback;
        return true;
    }

    if (!isCallInstanceFunction && !PHASE_OFF(Js::InlineAnyCallApplyTargetPhase, callInstr->m_func))
    {
        Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);
        Js::ProfileId callApplyCallSiteId = callInstr->m_func->GetJITFunctionBody()->GetCallApplyCallSiteIdForCallSiteId(callSiteId);

        if (callApplyCallSiteId != Js::Constants::NoProfileId)
        {
            *inlineeData = callInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallApplyTargetInlinee(callApplyCallSiteId);
        }
    }
    if (*inlineeData)
    {
        *targetType = CallApplyTargetSourceType::Other;
    }
    return *inlineeData != nullptr;
}